

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,double max_retperiod,int epcalc,int eptype,int eptype_tvar,int samplesize)

{
  double dVar1;
  pair<const_int,_std::vector<float,_std::allocator<float>_>_> *this_00;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  reference pfVar5;
  mapped_type *this_01;
  reference pvVar6;
  double dVar7;
  long *plVar8;
  code *local_188;
  double local_138;
  double retperiod_1;
  float local_128;
  offset_in_aggreports_to_subr local_120;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *pmStack_118;
  double local_110;
  double retperiod;
  iterator iStack_100;
  float lp;
  iterator __end2;
  iterator __begin2;
  lossvec *__range2;
  long i;
  OASIS_FLOAT tvar;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  size_t nextreturnperiodindex;
  pair<const_int,_std::vector<float,_std::allocator<float>_>_> *local_b8;
  lossvec *lpv;
  undefined1 local_a0 [8];
  pair<const_int,_std::vector<float,_std::allocator<float>_>_> s;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range1;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  int eptype_tvar_local;
  int eptype_local;
  int epcalc_local;
  double max_retperiod_local;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *items_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype_tvar;
  sVar3 = std::
          map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::size(items);
  if ((sVar3 != 0) && (samplesize != 0)) {
    std::
    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::map((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
           *)&__range1);
    __end1 = std::
             map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::begin(items);
    s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::end(items);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&s.second.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          , bVar2) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>
               ::operator*(&__end1);
      std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_int,_std::vector<float,_std::allocator<float>_>_> *)local_a0,ppVar4);
      local_b8 = &s;
      std::vector<float,_std::allocator<float>_>::rbegin
                ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff40);
      std::vector<float,_std::allocator<float>_>::rend
                ((vector<float,_std::allocator<float>_> *)&nextreturnperiodindex);
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffff40,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)&nextreturnperiodindex);
      this_00 = local_b8;
      last_computed_rp = 0.0;
      _tvar = 0.0;
      i._4_4_ = 0;
      i._0_4_ = 0.0;
      __range2 = (lossvec *)0x1;
      __end2 = std::vector<float,_std::allocator<float>_>::begin
                         ((vector<float,_std::allocator<float>_> *)local_b8);
      iStack_100 = std::vector<float,_std::allocator<float>_>::end
                             ((vector<float,_std::allocator<float>_> *)this_00);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff00), bVar2) {
        pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&__end2);
        retperiod._4_4_ = *pfVar5;
        local_110 = max_retperiod / (double)(long)__range2;
        if ((this->useReturnPeriodFile_ & 1U) == 0) {
          i._0_4_ = (float)i -
                    ((float)i - retperiod._4_4_ / (float)samplesize) / (float)(long)__range2;
          this_01 = std::
                    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                    ::operator[]((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                  *)&__range1,(key_type *)local_a0);
          retperiod_1 = local_110;
          local_128 = (float)i;
          std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_01,(value_type *)&retperiod_1);
          if (this->WriteEPTOutput != 0 ||
              this->WriteEPTOutput != 0 && *(long *)&this->field_0x158 != 0) {
            local_188 = (code *)this->WriteEPTOutput;
            plVar8 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
            if (((ulong)local_188 & 1) != 0) {
              local_188 = *(code **)(local_188 + *plVar8 + -1);
            }
            (*local_188)(local_110,retperiod._4_4_ / (float)samplesize,plVar8,fileIDs,local_a0._0_4_
                         ,epcalc,eptype);
          }
        }
        else {
          local_120 = this->WriteEPTOutput;
          pmStack_118 = *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                          **)&this->field_0x158;
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,
                     (OASIS_FLOAT *)((long)&i + 4),local_110,retperiod._4_4_ / (float)samplesize,
                     local_a0._0_4_,eptype,epcalc,max_retperiod,(int)__range2,(float)i,
                     (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&__range1,local_120,pmStack_118);
          i._0_4_ = (float)i -
                    ((float)i - retperiod._4_4_ / (float)samplesize) / (float)(long)__range2;
        }
        __range2 = (lossvec *)
                   ((long)&(__range2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1);
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&__end2);
      }
      if ((this->useReturnPeriodFile_ & 1U) != 0) {
        do {
          local_138 = max_retperiod / (double)(long)__range2;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->returnperiods_,(size_type)last_computed_rp);
          if (*pvVar6 < 1) {
            local_138 = 0.0;
          }
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,
                     (OASIS_FLOAT *)((long)&i + 4),local_138,0.0,local_a0._0_4_,eptype,epcalc,
                     max_retperiod,(int)__range2,(float)i,
                     (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&__range1,this->WriteEPTOutput,
                     *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                       **)&this->field_0x158);
          dVar1 = last_computed_rp;
          i._0_4_ = (float)i - (float)i / (float)(long)__range2;
          __range2 = (lossvec *)
                     ((long)&(__range2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start + 1);
          dVar7 = (double)std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
        } while ((ulong)dVar1 < (ulong)dVar7);
      }
      std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>::~pair
                ((pair<const_int,_std::vector<float,_std::allocator<float>_>_> *)local_a0);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>::
      operator++(&__end1);
    }
    if (((this->ordFlag_ & 1U) != 0) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,epcalc,tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&__range1);
    }
    std::
    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~map((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            *)&__range1);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec> &items,
	const double max_retperiod, int epcalc, int eptype, int eptype_tvar,
	int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    long i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput);
#endif
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
      } else {
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WriteEPTOutput != nullptr) {
	  (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				  lp / samplesize);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[EPT] != "") {
	  WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			     lp / samplesize);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}